

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

void __thiscall
kratos::FunctionCallVar::add_sink(FunctionCallVar *this,shared_ptr<kratos::AssignStmt> *stmt)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  undefined4 extraout_var;
  Generator *pGVar4;
  element_type *this_00;
  Var **ppVVar5;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined1 local_88 [16];
  undefined1 local_78 [32];
  string local_58;
  undefined8 local_38;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
  *iter;
  iterator __end1;
  iterator __begin1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
  *__range1;
  shared_ptr<kratos::AssignStmt> *stmt_local;
  FunctionCallVar *this_local;
  
  __end1 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
           ::begin(&this->args_);
  iter = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>
          *)std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>_>
            ::end(&this->args_);
  while (bVar1 = std::operator!=(&__end1,(_Self *)&iter), bVar1) {
    local_38 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
               ::operator*(&__end1);
    peVar3 = std::__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<kratos::Var,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&((reference)local_38)->second);
    (*(peVar3->super_IRNode)._vptr_IRNode[0x15])(peVar3,stmt);
    std::
    _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<kratos::Var>_>_>
    ::operator++(&__end1);
  }
  iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])();
  pGVar4 = Const::const_gen();
  if ((Generator *)CONCAT44(extraout_var,iVar2) == pGVar4) {
    this_00 = std::__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)stmt);
    ppVVar5 = AssignStmt::left(this_00);
    iVar2 = (*((*ppVVar5)->super_IRNode)._vptr_IRNode[0xd])();
    (this->super_Var).generator_ = (Generator *)CONCAT44(extraout_var_00,iVar2);
    iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])();
    FunctionStmtBlock::function_name_abi_cxx11_((string *)(local_78 + 0x20),this->func_def_);
    bVar1 = Generator::has_function
                      ((Generator *)CONCAT44(extraout_var_01,iVar2),(string *)(local_78 + 0x20));
    std::__cxx11::string::~string((string *)(local_78 + 0x20));
    if (((bVar1 ^ 0xffU) & 1) != 0) {
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])();
      Stmt::as<kratos::FunctionStmtBlock>((Stmt *)local_78);
      Generator::add_function
                ((Generator *)CONCAT44(extraout_var_02,iVar2),
                 (shared_ptr<kratos::FunctionStmtBlock> *)local_78);
      std::shared_ptr<kratos::FunctionStmtBlock>::~shared_ptr
                ((shared_ptr<kratos::FunctionStmtBlock> *)local_78);
      iVar2 = (*(this->super_Var).super_IRNode._vptr_IRNode[0xd])();
      Var::as<kratos::FunctionCallVar>((Var *)local_88);
      Generator::add_call_var
                ((Generator *)CONCAT44(extraout_var_03,iVar2),
                 (shared_ptr<kratos::FunctionCallVar> *)local_88);
      std::shared_ptr<kratos::FunctionCallVar>::~shared_ptr
                ((shared_ptr<kratos::FunctionCallVar> *)local_88);
    }
  }
  return;
}

Assistant:

void FunctionCallVar::add_sink(const std::shared_ptr<AssignStmt> &stmt) {
    for (auto const &iter : args_) {
        iter.second->add_sink(stmt);
    }
    // FIXME: this is a very hacky fix on constant generators
    if (generator() == Const::const_gen()) {
        // use left hand size of stmt
        generator_ = stmt->left()->generator();
        // change the function def to the new generator
        if (!generator()->has_function(func_def_->function_name())) {
            generator()->add_function(func_def_->as<FunctionStmtBlock>());
            generator()->add_call_var(as<FunctionCallVar>());
        }
    }
}